

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

Vec_Int_t * assignRandomBitsToCells(Abc_Ntk_t *pNtk,coloring *c)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p;
  int local_24;
  int bit;
  int i;
  Vec_Int_t *randVec;
  coloring *c_local;
  Abc_Ntk_t *pNtk_local;
  
  p = Vec_IntAlloc(1);
  local_24 = 0;
  while( true ) {
    iVar2 = Abc_NtkPiNum(pNtk);
    if (iVar2 <= local_24) break;
    rand();
    rand();
    uVar3 = rand();
    Vec_IntPush(p,uVar3 & 1);
    piVar1 = c->clen;
    iVar2 = Abc_NtkPoNum(pNtk);
    local_24 = piVar1[local_24 + iVar2] + 1 + local_24;
  }
  return p;
}

Assistant:

static Vec_Int_t * 
assignRandomBitsToCells(Abc_Ntk_t * pNtk, struct coloring *c)
{
    Vec_Int_t * randVec = Vec_IntAlloc( 1 );
    int i, bit;

    for (i = 0; i < Abc_NtkPiNum(pNtk); i += (c->clen[i+Abc_NtkPoNum(pNtk)]+1)) {
        bit = (int)(SIM_RANDOM_UNSIGNED % 2);
        Vec_IntPush(randVec, bit);
    }

    return randVec;
}